

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# blockchain.cpp
# Opt level: O2

optional<kernel::CCoinsStats> *
GetUTXOStats(optional<kernel::CCoinsStats> *__return_storage_ptr__,CCoinsView *view,
            BlockManager *blockman,CoinStatsHashType hash_type,function<void_()> *interruption_point
            ,CBlockIndex *pindex,bool index_requested)

{
  CBlockIndex *pCVar1;
  CBlockIndex **ppCVar2;
  long in_FS_OFFSET;
  UniqueLock<AnnotatedMixin<std::recursive_mutex>_> criticalblock36;
  bool local_79;
  base_blob<256U> local_78;
  base_blob<256U> local_58;
  long local_38;
  
  local_38 = *(long *)(in_FS_OFFSET + 0x28);
  if ((hash_type - MUHASH < 2) &&
     (index_requested &&
      (__uniq_ptr_impl<CoinStatsIndex,_std::default_delete<CoinStatsIndex>_>)
      g_coin_stats_index._M_t.
      super___uniq_ptr_impl<CoinStatsIndex,_std::default_delete<CoinStatsIndex>_>._M_t.
      super__Tuple_impl<0UL,_CoinStatsIndex_*,_std::default_delete<CoinStatsIndex>_>.
      super__Head_base<0UL,_CoinStatsIndex_*,_false>._M_head_impl !=
      (__uniq_ptr_impl<CoinStatsIndex,_std::default_delete<CoinStatsIndex>_>)0x0)) {
    if (pindex != (CBlockIndex *)0x0) {
      if (*(long *)(in_FS_OFFSET + 0x28) == local_38) {
        CoinStatsIndex::LookUpStats
                  (__return_storage_ptr__,
                   (CoinStatsIndex *)
                   g_coin_stats_index._M_t.
                   super___uniq_ptr_impl<CoinStatsIndex,_std::default_delete<CoinStatsIndex>_>._M_t.
                   super__Tuple_impl<0UL,_CoinStatsIndex_*,_std::default_delete<CoinStatsIndex>_>.
                   super__Head_base<0UL,_CoinStatsIndex_*,_false>._M_head_impl,pindex);
        return __return_storage_ptr__;
      }
      goto LAB_0026a291;
    }
    UniqueLock<AnnotatedMixin<std::recursive_mutex>_>::UniqueLock
              ((UniqueLock<AnnotatedMixin<std::recursive_mutex>_> *)&local_78,&cs_main,"::cs_main",
               "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/rpc/blockchain.cpp"
               ,0x396,false);
    (*view->_vptr_CCoinsView[2])(&local_58,view);
    pCVar1 = node::BlockManager::LookupBlockIndex(blockman,(uint256 *)&local_58);
    std::unique_lock<std::recursive_mutex>::~unique_lock
              ((unique_lock<std::recursive_mutex> *)&local_78);
    local_58.m_data._M_elems._0_8_ = pCVar1;
    ppCVar2 = inline_check_non_fatal<CBlockIndex*>
                        ((CBlockIndex **)&local_58,
                         "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/rpc/blockchain.cpp"
                         ,0x396,"GetUTXOStats",
                         "WITH_LOCK(::cs_main, return blockman.LookupBlockIndex(view->GetBestBlock()))"
                        );
    CoinStatsIndex::LookUpStats
              (__return_storage_ptr__,
               (CoinStatsIndex *)
               g_coin_stats_index._M_t.
               super___uniq_ptr_impl<CoinStatsIndex,_std::default_delete<CoinStatsIndex>_>._M_t.
               super__Tuple_impl<0UL,_CoinStatsIndex_*,_std::default_delete<CoinStatsIndex>_>.
               super__Head_base<0UL,_CoinStatsIndex_*,_false>._M_head_impl,*ppCVar2);
  }
  else {
    if (pindex == (CBlockIndex *)0x0) {
      local_79 = true;
    }
    else {
      CBlockIndex::GetBlockHash((uint256 *)&local_58,pindex);
      (*view->_vptr_CCoinsView[2])(&local_78,view);
      local_79 = operator==(&local_58,&local_78);
    }
    inline_check_non_fatal<bool>
              (&local_79,
               "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/rpc/blockchain.cpp"
               ,0x39f,"GetUTXOStats","!pindex || pindex->GetBlockHash() == view->GetBestBlock()");
    kernel::ComputeUTXOStats(__return_storage_ptr__,hash_type,view,blockman,interruption_point);
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == local_38) {
    return __return_storage_ptr__;
  }
LAB_0026a291:
  __stack_chk_fail();
}

Assistant:

static std::optional<kernel::CCoinsStats> GetUTXOStats(CCoinsView* view, node::BlockManager& blockman,
                                                       kernel::CoinStatsHashType hash_type,
                                                       const std::function<void()>& interruption_point = {},
                                                       const CBlockIndex* pindex = nullptr,
                                                       bool index_requested = true)
{
    // Use CoinStatsIndex if it is requested and available and a hash_type of Muhash or None was requested
    if ((hash_type == kernel::CoinStatsHashType::MUHASH || hash_type == kernel::CoinStatsHashType::NONE) && g_coin_stats_index && index_requested) {
        if (pindex) {
            return g_coin_stats_index->LookUpStats(*pindex);
        } else {
            CBlockIndex& block_index = *CHECK_NONFATAL(WITH_LOCK(::cs_main, return blockman.LookupBlockIndex(view->GetBestBlock())));
            return g_coin_stats_index->LookUpStats(block_index);
        }
    }

    // If the coinstats index isn't requested or is otherwise not usable, the
    // pindex should either be null or equal to the view's best block. This is
    // because without the coinstats index we can only get coinstats about the
    // best block.
    CHECK_NONFATAL(!pindex || pindex->GetBlockHash() == view->GetBestBlock());

    return kernel::ComputeUTXOStats(hash_type, view, blockman, interruption_point);
}